

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall
TTD::TTEventList::DeleteFirstEntry(TTEventList *this,TTEventListLink *block,EventLogEntry *data)

{
  size_t sVar1;
  EventLogEntryVTableEntry *pEVar2;
  ulong uVar3;
  
  sVar1 = block->StartPos;
  if ((EventLogEntry *)(block->BlockData + sVar1) != data) {
    TTDAbort_unrecoverable_error("Not the data at the start of the list!!!");
  }
  pEVar2 = this->m_vtable;
  uVar3 = (ulong)data->EventKind;
  if (pEVar2[uVar3].UnloadFP != (fPtr_EventLogEntryInfoUnload)0x0) {
    (*pEVar2[uVar3].UnloadFP)(data,this->m_alloc);
    pEVar2 = this->m_vtable;
    uVar3 = (ulong)data->EventKind;
    sVar1 = block->StartPos;
  }
  sVar1 = sVar1 + pEVar2[uVar3].DataSize;
  block->StartPos = sVar1;
  if (sVar1 == block->CurrPos) {
    RemoveArrayLink(this,block);
    return;
  }
  return;
}

Assistant:

void TTEventList::DeleteFirstEntry(TTEventListLink* block, NSLogEvents::EventLogEntry* data)
    {
        TTDAssert(reinterpret_cast<NSLogEvents::EventLogEntry*>(block->BlockData + block->StartPos) == data, "Not the data at the start of the list!!!");

        auto unloadFP = this->m_vtable[(uint32)data->EventKind].UnloadFP; //use vtable magic here

        if(unloadFP != nullptr)
        {
            unloadFP(data, *(this->m_alloc));
        }

        block->StartPos += this->m_vtable[(uint32)data->EventKind].DataSize;
        if(block->StartPos == block->CurrPos)
        {
            this->RemoveArrayLink(block);
        }
    }